

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Performance::anon_unknown_1::MapBufferRangeFlushCase::init
          (MapBufferRangeFlushCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  TestLog *this_00;
  MessageBuilder *pMVar2;
  EVP_PKEY_CTX *ctx_00;
  byte local_249;
  char *local_228;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8 [3];
  MessageBuilder local_190;
  MapBufferRangeFlushCase *local_10;
  MapBufferRangeFlushCase *this_local;
  
  local_10 = this;
  this_00 = tcu::TestContext::getLog
                      ((this->
                       super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
                       ).
                       super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
                       .super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_190,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<
                     (&local_190,
                      (char (*) [103])
                      "Testing glMapBufferRange(), glFlushMappedBufferRange() and glUnmapBuffer() function call performance.\n"
                     );
  local_1a8[0] = "Half of the buffer is mapped.";
  if ((this->m_fullUpload & 1U) != 0) {
    local_1a8[0] = "The whole buffer is mapped.";
  }
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,local_1a8);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [2])0x2b9e07b);
  if ((this->m_flushInParts & 1U) == 0) {
    local_228 = "The whole mapped range is flushed in one flush call.";
    if ((this->m_flushPartial & 1U) != 0) {
      local_228 = "Half of the buffer range is flushed.";
    }
  }
  else {
    local_228 = 
    "The mapped range is partitioned to 4 subranges and each partition is flushed separately.";
  }
  local_1b0 = local_228;
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_1b0);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [2])0x2b9e07b);
  local_1b8 = "";
  if ((this->m_useUnusedUnspecifiedBuffer & 1U) != 0) {
    local_1b8 = 
    "The buffer has not been used before mapping and is allocated with unspecified contents.\n";
  }
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_1b8);
  local_1c0 = "";
  if ((this->m_useUnusedSpecifiedBuffer & 1U) != 0) {
    local_1c0 = 
    "The buffer has not been used before mapping and is allocated with specified contents.\n";
  }
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_1c0);
  local_249 = 0;
  if ((this->m_useUnusedSpecifiedBuffer & 1U) == 0) {
    local_249 = this->m_useUnusedUnspecifiedBuffer ^ 0xff;
  }
  local_1c8 = "";
  if ((local_249 & 1) != 0) {
    local_1c8 = "The buffer has previously been used in a drawing operation.\n";
  }
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_1c8);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [11])"Map bits:\n");
  local_1d0 = "";
  if ((this->m_mapFlags & 2) != 0) {
    local_1d0 = "\tGL_MAP_WRITE_BIT\n";
  }
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_1d0);
  local_1d8 = "";
  if ((this->m_mapFlags & 1) != 0) {
    local_1d8 = "\tGL_MAP_READ_BIT\n";
  }
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_1d8);
  local_1e0 = "";
  if ((this->m_mapFlags & 4) != 0) {
    local_1e0 = "\tGL_MAP_INVALIDATE_RANGE_BIT\n";
  }
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_1e0);
  local_1e8 = "";
  if ((this->m_mapFlags & 8) != 0) {
    local_1e8 = "\tGL_MAP_INVALIDATE_BUFFER_BIT\n";
  }
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_1e8);
  local_1f0 = "";
  if ((this->m_mapFlags & 0x20) != 0) {
    local_1f0 = "\tGL_MAP_UNSYNCHRONIZED_BIT\n";
  }
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_1f0);
  local_1f8 = "";
  if ((this->m_mapFlags & 0x10) != 0) {
    local_1f8 = "\tGL_MAP_FLUSH_EXPLICIT_BIT\n";
  }
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_1f8);
  ctx_00 = (EVP_PKEY_CTX *)&tcu::TestLog::EndMessage;
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_190);
  iVar1 = BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
          ::init(&this->
                  super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
                 ,ctx_00);
  return iVar1;
}

Assistant:

void MapBufferRangeFlushCase::init (void)
{
	// Describe what the test tries to do
	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Testing glMapBufferRange(), glFlushMappedBufferRange() and glUnmapBuffer() function call performance.\n"
		<< ((m_fullUpload) ? ("The whole buffer is mapped.") : ("Half of the buffer is mapped.")) << "\n"
		<< ((m_flushInParts) ?
			("The mapped range is partitioned to 4 subranges and each partition is flushed separately.") :
			(m_flushPartial) ?
				("Half of the buffer range is flushed.") :
				("The whole mapped range is flushed in one flush call.")) << "\n"
		<< ((m_useUnusedUnspecifiedBuffer) ? ("The buffer has not been used before mapping and is allocated with unspecified contents.\n") : (""))
		<< ((m_useUnusedSpecifiedBuffer) ? ("The buffer has not been used before mapping and is allocated with specified contents.\n") : (""))
		<< ((!m_useUnusedSpecifiedBuffer && !m_useUnusedUnspecifiedBuffer) ? ("The buffer has previously been used in a drawing operation.\n") : (""))
		<< "Map bits:\n"
		<< ((m_mapFlags & GL_MAP_WRITE_BIT) ? ("\tGL_MAP_WRITE_BIT\n") : (""))
		<< ((m_mapFlags & GL_MAP_READ_BIT) ? ("\tGL_MAP_READ_BIT\n") : (""))
		<< ((m_mapFlags & GL_MAP_INVALIDATE_RANGE_BIT) ? ("\tGL_MAP_INVALIDATE_RANGE_BIT\n") : (""))
		<< ((m_mapFlags & GL_MAP_INVALIDATE_BUFFER_BIT) ? ("\tGL_MAP_INVALIDATE_BUFFER_BIT\n") : (""))
		<< ((m_mapFlags & GL_MAP_UNSYNCHRONIZED_BIT) ? ("\tGL_MAP_UNSYNCHRONIZED_BIT\n") : (""))
		<< ((m_mapFlags & GL_MAP_FLUSH_EXPLICIT_BIT) ? ("\tGL_MAP_FLUSH_EXPLICIT_BIT\n") : (""))
		<< tcu::TestLog::EndMessage;

	BasicUploadCase<MapBufferRangeFlushDuration>::init();
}